

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O1

bool Cipher::encryptExact(TParameters *param_1,string *text,TClusters *clusters)

{
  char cVar1;
  int iVar2;
  size_type sVar3;
  pointer pcVar4;
  pointer piVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  int iVar8;
  uint uVar9;
  size_type sVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  string *__range2;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  vector<int,_std::allocator<int>_> alphabetTransformation;
  array<int,_256UL> myCharToLetter;
  allocator_type local_441;
  vector<int,_std::allocator<int>_> local_440;
  uint local_428 [256];
  
  memcpy(local_428,(anonymous_namespace)::kCharToLetter,0x400);
  sVar3 = text->_M_string_length;
  if (sVar3 == 0) {
    uVar13 = 0x1b;
  }
  else {
    pcVar4 = (text->_M_dataplus)._M_p;
    uVar13 = 0x1b;
    sVar10 = 0;
    do {
      cVar1 = pcVar4[sVar10];
      if (local_428[cVar1] == 0) {
        uVar13 = uVar13 + 1;
        local_428[cVar1] = uVar13;
      }
      sVar10 = sVar10 + 1;
    } while (sVar3 != sVar10);
  }
  printf("[encryptExact] Unique symbols = %d\n",(ulong)uVar13);
  std::vector<int,_std::allocator<int>_>::vector(&local_440,(long)(int)uVar13,&local_441);
  auVar7 = _DAT_001230a0;
  uVar9 = (uint)((ulong)((long)local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  if (0 < (int)uVar9) {
    lVar11 = (ulong)(uVar9 & 0x7fffffff) - 1;
    auVar14._8_4_ = (int)lVar11;
    auVar14._0_8_ = lVar11;
    auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar12 = 0;
    auVar14 = auVar14 ^ _DAT_001230a0;
    auVar15 = _DAT_00123090;
    do {
      auVar16 = auVar15 ^ auVar7;
      if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                  auVar14._4_4_ < auVar16._4_4_) & 1)) {
        local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar12] = (int)uVar12;
      }
      if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
          auVar16._12_4_ <= auVar14._12_4_) {
        local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar12 + 1] = (int)uVar12 + 1;
      }
      uVar12 = uVar12 + 2;
      lVar11 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar11 + 2;
    } while ((uVar9 + 1 & 0xfffffffe) != uVar12);
  }
  if (1 < (int)uVar9) {
    uVar12 = (ulong)(uVar9 & 0x7fffffff);
    do {
      iVar8 = rand();
      iVar8 = iVar8 % (int)uVar12;
      iVar2 = local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12 - 1];
      local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar12 - 1] =
           local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar8];
      local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar8] = iVar2;
      bVar6 = 2 < (long)uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar6);
  }
  std::vector<int,_std::allocator<int>_>::resize(clusters,text->_M_string_length);
  uVar9 = (uint)text->_M_string_length;
  if (0 < (int)uVar9) {
    pcVar4 = (text->_M_dataplus)._M_p;
    piVar5 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      if ((long)(int)local_428[pcVar4[uVar12]] < 1) {
        __assert_fail("myCharToLetter[text[i]] > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                      ,0x249,
                      "bool Cipher::encryptExact(const TParameters &, const std::string &, TClusters &)"
                     );
      }
      iVar2 = local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(long)(int)local_428[pcVar4[uVar12]] + -1];
      piVar5[uVar12] = iVar2 + 1;
      if ((iVar2 < 0) || ((int)uVar13 <= iVar2)) {
        __assert_fail("clusters[i] > 0 && clusters[i] <= k",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                      ,0x24b,
                      "bool Cipher::encryptExact(const TParameters &, const std::string &, TClusters &)"
                     );
      }
      uVar12 = uVar12 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar12);
  }
  if (local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool encryptExact(const TParameters & , const std::string & text, TClusters & clusters) {
        auto myCharToLetter = kCharToLetter;

		int k = 27;
        {
            for (auto & p : text) {
                if (myCharToLetter[p] == 0) {
                    myCharToLetter[p] = ++k;
                }
            }
            printf("[encryptExact] Unique symbols = %d\n", k);
        }

		std::vector<TClusterId> alphabetTransformation(k);
		for (int i = 0; i < (int) alphabetTransformation.size(); ++i) {
			alphabetTransformation[i] = i;
		}

		shuffle(alphabetTransformation);

		clusters.resize(text.size());

		for (int i = 0; i < (int) text.size(); ++i) {
			assert(myCharToLetter[text[i]] > 0);
			clusters[i] = alphabetTransformation[myCharToLetter[text[i]] - 1] + 1;
			assert(clusters[i] > 0 && clusters[i] <= k);
		}

        return true;
    }